

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CompositeATN.hpp
# Opt level: O0

CATNClosure * __thiscall
Centaurus::CompositeATN<wchar_t>::build_closure
          (CATNClosure *__return_storage_ptr__,CompositeATN<wchar_t> *this,CATNClosure *closure)

{
  bool bVar1;
  int color;
  reference this_00;
  ATNPath *path;
  PriorityChain *priority;
  CATNClosureElement *p;
  iterator __end2;
  iterator __begin2;
  CATNClosure *__range2;
  undefined1 local_48 [8];
  ATNStateStack stack;
  CATNClosure *closure_local;
  CompositeATN<wchar_t> *this_local;
  CATNClosure *ret;
  
  stack.
  super_vector<std::pair<Centaurus::Identifier,_int>,_std::allocator<std::pair<Centaurus::Identifier,_int>_>_>
  .
  super__Vector_base<std::pair<Centaurus::Identifier,_int>,_std::allocator<std::pair<Centaurus::Identifier,_int>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ = 0;
  std::
  set<Centaurus::CATNClosureElement,_std::less<Centaurus::CATNClosureElement>,_std::allocator<Centaurus::CATNClosureElement>_>
  ::set(__return_storage_ptr__);
  ATNPath::ATNPath((ATNPath *)local_48);
  __end2 = std::
           set<Centaurus::CATNClosureElement,_std::less<Centaurus::CATNClosureElement>,_std::allocator<Centaurus::CATNClosureElement>_>
           ::begin(closure);
  p = (CATNClosureElement *)
      std::
      set<Centaurus::CATNClosureElement,_std::less<Centaurus::CATNClosureElement>,_std::allocator<Centaurus::CATNClosureElement>_>
      ::end(closure);
  while( true ) {
    bVar1 = std::operator!=(&__end2,(_Self *)&p);
    if (!bVar1) break;
    this_00 = std::_Rb_tree_const_iterator<Centaurus::CATNClosureElement>::operator*(&__end2);
    path = CATNClosureElement::path(this_00);
    color = CATNClosureElement::color(this_00);
    priority = CATNClosureElement::priority(this_00);
    build_closure_inclusive
              (this,__return_storage_ptr__,path,color,(ATNStateStack *)local_48,priority);
    std::_Rb_tree_const_iterator<Centaurus::CATNClosureElement>::operator++(&__end2);
  }
  stack.
  super_vector<std::pair<Centaurus::Identifier,_int>,_std::allocator<std::pair<Centaurus::Identifier,_int>_>_>
  .
  super__Vector_base<std::pair<Centaurus::Identifier,_int>,_std::allocator<std::pair<Centaurus::Identifier,_int>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ = 1;
  ATNPath::~ATNPath((ATNPath *)local_48);
  if ((stack.
       super_vector<std::pair<Centaurus::Identifier,_int>,_std::allocator<std::pair<Centaurus::Identifier,_int>_>_>
       .
       super__Vector_base<std::pair<Centaurus::Identifier,_int>,_std::allocator<std::pair<Centaurus::Identifier,_int>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ & 1) == 0) {
    std::
    set<Centaurus::CATNClosureElement,_std::less<Centaurus::CATNClosureElement>,_std::allocator<Centaurus::CATNClosureElement>_>
    ::~set(__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

CATNClosure build_closure(const CATNClosure& closure) const
    {
        CATNClosure ret;

        ATNStateStack stack;

        for (const auto& p : closure)
        {
            build_closure_inclusive(ret, p.path(), p.color(), stack, p.priority());
        }

        return ret;
    }